

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioned_hashtable.cpp
# Opt level: O2

void __thiscall
duckdb::RadixHTLocalSourceState::Scan
          (RadixHTLocalSourceState *this,RadixHTGlobalSinkState *sink,
          RadixHTGlobalSourceState *gstate,DataChunk *chunk)

{
  DataChunk *result;
  Vector *addresses;
  atomic<unsigned_long> *paVar1;
  __int_type _Var2;
  RadixPartitionedHashTable *pRVar3;
  GroupingSet *pGVar4;
  size_type *psVar5;
  bool bVar6;
  reference this_00;
  type pAVar7;
  type this_01;
  reference pvVar8;
  reference pvVar9;
  _Base_ptr p_Var10;
  idx_t iVar11;
  const_reference value;
  GroupedAggregateData *this_02;
  idx_t i;
  idx_t col_idx;
  size_type sVar12;
  ulong uVar13;
  size_type *psVar14;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  unique_lock<std::mutex> guard;
  
  this_00 = vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_true>
            ::get<true>(&sink->partitions,this->task_idx);
  pAVar7 = unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>
           ::operator*(this_00);
  this_01 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
            ::operator*(&pAVar7->data);
  if (this->scan_status == INIT) {
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_58,
               &(gstate->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
    TupleDataCollection::InitializeScan
              (this_01,&this->scan_state,(vector<unsigned_long,_true> *)&local_58,
               sink->scan_pin_properties);
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_58);
    this->scan_status = IN_PROGRESS;
  }
  result = &this->scan_chunk;
  bVar6 = TupleDataCollection::Scan(this_01,&this->scan_state,result);
  if (bVar6) {
    addresses = &(this->scan_state).chunk_state.row_locations;
    RowOperations::FinalizeStates
              (&this->row_state,&this->layout,addresses,result,
               ((long)(this->layout).types.
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->layout).types.
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x18 - 1);
    if ((sink->scan_pin_properties == DESTROY_AFTER_DONE) &&
       ((this->layout).aggr_destructor_idxs.
        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (this->layout).aggr_destructor_idxs.
        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      RowOperations::DestroyStates
                (&this->row_state,&this->layout,addresses,(this->scan_chunk).count);
    }
    pRVar3 = sink->radix_ht;
    pGVar4 = pRVar3->grouping_set;
    p_Var10 = (pGVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    sVar12 = 0;
    while ((_Rb_tree_header *)p_Var10 != &(pGVar4->_M_t)._M_impl.super__Rb_tree_header) {
      pvVar8 = vector<duckdb::Vector,_true>::get<true>(&chunk->data,*(size_type *)(p_Var10 + 1));
      pvVar9 = vector<duckdb::Vector,_true>::get<true>(&result->data,sVar12);
      Vector::Reference(pvVar8,pvVar9);
      p_Var10 = (_Base_ptr)::std::_Rb_tree_increment(p_Var10);
      sVar12 = sVar12 + 1;
    }
    psVar5 = (pRVar3->null_groups).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (psVar14 = (pRVar3->null_groups).super_vector<unsigned_long,_std::allocator<unsigned_long>_>
                   .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start; psVar14 != psVar5; psVar14 = psVar14 + 1) {
      sVar12 = *psVar14;
      pvVar8 = vector<duckdb::Vector,_true>::get<true>(&chunk->data,sVar12);
      Vector::SetVectorType(pvVar8,CONSTANT_VECTOR);
      pvVar8 = vector<duckdb::Vector,_true>::get<true>(&chunk->data,sVar12);
      ConstantVector::SetNull(pvVar8,true);
    }
    for (uVar13 = 0; this_02 = pRVar3->op,
        uVar13 < (ulong)((long)(this_02->aggregates).
                               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this_02->aggregates).
                               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3); uVar13 = uVar13 + 1)
    {
      iVar11 = GroupedAggregateData::GroupCount(this_02);
      pvVar8 = vector<duckdb::Vector,_true>::get<true>(&chunk->data,iVar11 + uVar13);
      pvVar9 = vector<duckdb::Vector,_true>::get<true>
                         (&result->data,
                          ((long)(pRVar3->group_types).
                                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                 .
                                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pRVar3->group_types).
                                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                .
                                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0x18 + uVar13);
      Vector::Reference(pvVar8,pvVar9);
    }
    for (uVar13 = 0;
        uVar13 < (ulong)(((long)(this_02->grouping_functions).
                                super_vector<duckdb::vector<unsigned_long,_true>,_std::allocator<duckdb::vector<unsigned_long,_true>_>_>
                                .
                                super__Vector_base<duckdb::vector<unsigned_long,_true>,_std::allocator<duckdb::vector<unsigned_long,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this_02->grouping_functions).
                               super_vector<duckdb::vector<unsigned_long,_true>,_std::allocator<duckdb::vector<unsigned_long,_true>_>_>
                               .
                               super__Vector_base<duckdb::vector<unsigned_long,_true>,_std::allocator<duckdb::vector<unsigned_long,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x18);
        uVar13 = uVar13 + 1) {
      iVar11 = GroupedAggregateData::GroupCount(this_02);
      pvVar8 = vector<duckdb::Vector,_true>::get<true>
                         (&chunk->data,
                          ((long)(pRVar3->op->aggregates).
                                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pRVar3->op->aggregates).
                                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) + iVar11 + uVar13);
      value = vector<duckdb::Value,_true>::get<true>(&pRVar3->grouping_values,uVar13);
      Vector::Reference(pvVar8,value);
      this_02 = pRVar3->op;
    }
    chunk->count = (this->scan_chunk).count;
  }
  else {
    if (sink->scan_pin_properties == DESTROY_AFTER_DONE) {
      TupleDataCollection::Reset(this_01);
    }
    this->scan_status = DONE;
    ::std::unique_lock<std::mutex>::unique_lock
              (&guard,&(sink->super_GlobalSinkState).super_StateWithBlockableTasks.lock);
    LOCK();
    paVar1 = &gstate->task_done;
    _Var2 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    if (_Var2 + 1 ==
        (long)(sink->partitions).
              super_vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(sink->partitions).
              super_vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) {
      LOCK();
      (gstate->finished)._M_base._M_i = true;
      UNLOCK();
    }
    ::std::unique_lock<std::mutex>::~unique_lock(&guard);
  }
  return;
}

Assistant:

void RadixHTLocalSourceState::Scan(RadixHTGlobalSinkState &sink, RadixHTGlobalSourceState &gstate, DataChunk &chunk) {
	D_ASSERT(task == RadixHTSourceTaskType::SCAN);
	D_ASSERT(scan_status != RadixHTScanStatus::DONE);

	auto &partition = *sink.partitions[task_idx];
	D_ASSERT(partition.state == AggregatePartitionState::READY_TO_SCAN);
	auto &data_collection = *partition.data;

	if (scan_status == RadixHTScanStatus::INIT) {
		data_collection.InitializeScan(scan_state, gstate.column_ids, sink.scan_pin_properties);
		scan_status = RadixHTScanStatus::IN_PROGRESS;
	}

	if (!data_collection.Scan(scan_state, scan_chunk)) {
		if (sink.scan_pin_properties == TupleDataPinProperties::DESTROY_AFTER_DONE) {
			data_collection.Reset();
		}
		scan_status = RadixHTScanStatus::DONE;
		auto guard = sink.Lock();
		if (++gstate.task_done == sink.partitions.size()) {
			gstate.finished = true;
		}
		return;
	}

	const auto group_cols = layout.ColumnCount() - 1;
	RowOperations::FinalizeStates(row_state, layout, scan_state.chunk_state.row_locations, scan_chunk, group_cols);

	if (sink.scan_pin_properties == TupleDataPinProperties::DESTROY_AFTER_DONE && layout.HasDestructor()) {
		RowOperations::DestroyStates(row_state, layout, scan_state.chunk_state.row_locations, scan_chunk.size());
	}

	auto &radix_ht = sink.radix_ht;
	idx_t chunk_index = 0;
	for (auto &entry : radix_ht.grouping_set) {
		chunk.data[entry].Reference(scan_chunk.data[chunk_index++]);
	}
	for (auto null_group : radix_ht.null_groups) {
		chunk.data[null_group].SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::SetNull(chunk.data[null_group], true);
	}
	D_ASSERT(radix_ht.grouping_set.size() + radix_ht.null_groups.size() == radix_ht.op.GroupCount());
	for (idx_t col_idx = 0; col_idx < radix_ht.op.aggregates.size(); col_idx++) {
		chunk.data[radix_ht.op.GroupCount() + col_idx].Reference(
		    scan_chunk.data[radix_ht.group_types.size() + col_idx]);
	}
	D_ASSERT(radix_ht.op.grouping_functions.size() == radix_ht.grouping_values.size());
	for (idx_t i = 0; i < radix_ht.op.grouping_functions.size(); i++) {
		chunk.data[radix_ht.op.GroupCount() + radix_ht.op.aggregates.size() + i].Reference(radix_ht.grouping_values[i]);
	}
	chunk.SetCardinality(scan_chunk);
	D_ASSERT(chunk.size() != 0);
}